

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeMixing(ProjectWriter *this)

{
  undefined1 *puVar1;
  pointer ppNVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ostream *poVar7;
  Tank *tank;
  pointer ppNVar8;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[MIXING]\n");
  ppNVar2 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar8 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar8 != ppNVar2; ppNVar8 = ppNVar8 + 1) {
    pNVar3 = *ppNVar8;
    iVar6 = (*(pNVar3->super_Element)._vptr_Element[2])(pNVar3);
    if (iVar6 == 1) {
      lVar4 = *(long *)&this->field_0x18;
      lVar5 = *(long *)(lVar4 + -0x18);
      *(uint *)(&this->field_0x30 + lVar5) =
           *(uint *)(&this->field_0x30 + lVar5) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar4 + -0x18)) = 0x10;
      poVar7 = std::operator<<((ostream *)puVar1,(string *)&(pNVar3->super_Element).name);
      std::operator<<(poVar7," ");
      lVar4 = *(long *)&this->field_0x18;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar4 + -0x18)) = 0xc;
      *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar4 + -0x18)) = 4;
      std::operator<<((ostream *)puVar1,TankMixModel::MixingModelWords[*(int *)&pNVar3[1].xCoord]);
      poVar7 = std::ostream::_M_insert<double>(pNVar3[1].initQual);
      std::operator<<(poVar7,"\n");
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeMixing()
{
    fout << "\n[MIXING]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::TANK )
    	{
    	    Tank* tank = static_cast<Tank*>(node);
    	    fout << left << setw(16) << node->name << " ";
    	    fout << setw(12) << fixed << setprecision(4);
    	    fout << TankMixModel::MixingModelWords[tank->mixingModel.type];
    	    fout << tank->mixingModel.fracMixed << "\n";
    	}
    }
}